

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsDataBuffer helicsInputGetDataBuffer(HelicsInput inp,HelicsError *err)

{
  SmallBuffer *buff;
  string_view sVar1;
  SmallBuffer *ptr;
  data_view bytes;
  InputObject *inpObj;
  Input *in_stack_ffffffffffffff78;
  HelicsError *in_stack_ffffffffffffff80;
  HelicsInput in_stack_ffffffffffffff88;
  data_view local_40;
  InputObject *local_20;
  HelicsDataBuffer local_8;
  
  local_20 = anon_unknown.dwarf_5d1c2::verifyInput
                       (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (local_20 == (InputObject *)0x0) {
    local_8 = (HelicsDataBuffer)0x0;
  }
  else {
    helics::Input::getBytes(in_stack_ffffffffffffff78);
    buff = (SmallBuffer *)operator_new(0x60);
    sVar1 = helics::data_view::string_view(&local_40);
    helics::SmallBuffer::SmallBuffer<std::basic_string_view<char,std::char_traits<char>>,void>
              ((SmallBuffer *)sVar1._M_str,
               (basic_string_view<char,_std::char_traits<char>_> *)sVar1._M_len);
    local_8 = createAPIDataBuffer(buff);
    helics::data_view::~data_view((data_view *)0x1cf16d);
  }
  return local_8;
}

Assistant:

HelicsDataBuffer helicsInputGetDataBuffer(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return (nullptr);
    }
    const helics::data_view bytes = inpObj->inputPtr->getBytes();
    auto* ptr = new helics::SmallBuffer(bytes.string_view());
    return createAPIDataBuffer(*ptr);
}